

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

void __thiscall particleSamples::perform_particle_reconstruction(particleSamples *this)

{
  vector<particle_info,std::allocator<particle_info>> *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined4 uVar15;
  anon_struct_120_15_f999644b *__args;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar16;
  long lVar17;
  ulong uVar18;
  pointer ppvVar19;
  pointer ppvVar20;
  ulong uVar21;
  pointer paVar22;
  pointer paVar23;
  iterator __position;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  byte bVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  
  bVar27 = 0;
  if (this->particle_monval == 0x14d) {
    pvVar16 = this->reconst_list_1;
    ppvVar19 = (pvVar16->
               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar16->
        super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppvVar19) {
      uVar25 = 0;
      do {
        paVar22 = (ppvVar19[uVar25]->
                  super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ppvVar19[uVar25]->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
            _M_impl.super__Vector_impl_data._M_finish != paVar22) {
          ppvVar20 = (this->reconst_list_2->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          uVar24 = 0;
          do {
            paVar23 = (ppvVar20[uVar25]->
                      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if (*(pointer *)
                 ((long)&(ppvVar20[uVar25]->
                         super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
                         super__Vector_impl_data + 8) != paVar23) {
              dVar7 = paVar22[uVar24].px;
              dVar8 = (&paVar22[uVar24].px)[1];
              dVar9 = paVar22[uVar24].pz;
              dVar10 = (&paVar22[uVar24].pz)[1];
              dVar11 = paVar22[uVar24].x;
              dVar12 = (&paVar22[uVar24].x)[1];
              dVar13 = paVar22[uVar24].z;
              dVar14 = (&paVar22[uVar24].z)[1];
              uVar18 = 0;
              uVar21 = 1;
              do {
                dVar28 = paVar23[uVar18].px + dVar7;
                dVar30 = (&paVar23[uVar18].px)[1] + dVar8;
                dVar32 = paVar23[uVar18].pz + dVar9;
                dVar33 = (&paVar23[uVar18].pz)[1] + dVar10;
                dVar3 = paVar23[uVar18].x;
                dVar4 = (&paVar23[uVar18].x)[1];
                dVar5 = paVar23[uVar18].z;
                dVar6 = (&paVar23[uVar18].z)[1];
                dVar1 = ((dVar33 * dVar33 - dVar28 * dVar28) - dVar30 * dVar30) - dVar32 * dVar32;
                if (dVar1 < 0.0) {
                  dVar1 = sqrt(dVar1);
                }
                else {
                  dVar1 = SQRT(dVar1);
                }
                if ((ABS(dVar1 + -1.019) < 0.00443) &&
                   (dVar1 = dVar13 - dVar5, dVar2 = dVar14 - dVar6, dVar29 = dVar11 - dVar3,
                   dVar31 = dVar12 - dVar4,
                   SQRT(dVar1 * dVar1 + dVar31 * dVar31 + dVar2 * dVar2 + dVar29 * dVar29) < 0.01))
                {
                  __args = (anon_struct_120_15_f999644b *)operator_new(0x78);
                  __args->mass = 1.019;
                  __args->px = dVar28;
                  __args->py = dVar30;
                  __args->pz = dVar32;
                  __args->E = dVar33;
                  __args->x = (dVar3 + dVar11) * 0.5;
                  __args->y = (dVar4 + dVar12) * 0.5;
                  __args->z = (dVar5 + dVar13) * 0.5;
                  __args->t = (dVar6 + dVar14) * 0.5;
                  this_00 = (vector<particle_info,std::allocator<particle_info>> *)
                            (this->particle_list->
                            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar25];
                  __position._M_current = *(anon_struct_120_15_f999644b **)(this_00 + 8);
                  if (__position._M_current == *(anon_struct_120_15_f999644b **)(this_00 + 0x10)) {
                    std::vector<particle_info,std::allocator<particle_info>>::
                    _M_realloc_insert<particle_info_const&>(this_00,__position,__args);
                  }
                  else {
                    for (lVar17 = 0xf; lVar17 != 0; lVar17 = lVar17 + -1) {
                      uVar15 = *(undefined4 *)&__args->field_0x4;
                      (__position._M_current)->monval = __args->monval;
                      *(undefined4 *)&(__position._M_current)->field_0x4 = uVar15;
                      __args = (anon_struct_120_15_f999644b *)
                               ((long)__args + (ulong)bVar27 * -0x10 + 8);
                      __position._M_current = __position._M_current + (ulong)bVar27 * -0x10 + 8;
                    }
                    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x78;
                  }
                }
                ppvVar20 = (this->reconst_list_2->
                           super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                paVar23 = (ppvVar20[uVar25]->
                          super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
                          .super__Vector_impl_data._M_start;
                uVar18 = ((long)*(pointer *)
                                 ((long)&(ppvVar20[uVar25]->
                                         super__Vector_base<particle_info,_std::allocator<particle_info>_>
                                         )._M_impl.super__Vector_impl_data + 8) - (long)paVar23 >> 3
                         ) * -0x1111111111111111;
                bVar26 = uVar21 <= uVar18;
                lVar17 = uVar18 - uVar21;
                uVar18 = uVar21;
                uVar21 = (ulong)((int)uVar21 + 1);
              } while (bVar26 && lVar17 != 0);
              pvVar16 = this->reconst_list_1;
              ppvVar19 = (pvVar16->
                         super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                         )._M_impl.super__Vector_impl_data._M_start;
            }
            uVar24 = (ulong)((int)uVar24 + 1);
            paVar22 = (ppvVar19[uVar25]->
                      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar18 = ((long)(ppvVar19[uVar25]->
                            super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)paVar22 >> 3) *
                     -0x1111111111111111;
          } while (uVar24 <= uVar18 && uVar18 - uVar24 != 0);
        }
        uVar25 = (ulong)((int)uVar25 + 1);
      } while (uVar25 < (ulong)((long)(pvVar16->
                                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar19
                               >> 3));
    }
  }
  return;
}

Assistant:

void particleSamples::perform_particle_reconstruction() {
    if (particle_monval == 333) {
        // particle of interest is phi(1020)
        double particle_mass = 1.019;
        double particle_width = 0.00443;

        // now we loop over events
        for (unsigned int iev = 0; iev < reconst_list_1->size(); iev++) {
            // we first perfrom the (K^+, K^-) pair
            for (unsigned int i = 0; i < (*reconst_list_1)[iev]->size(); i++) {
                double E_1 = (*(*reconst_list_1)[iev])[i].E;
                double px_1 = (*(*reconst_list_1)[iev])[i].px;
                double py_1 = (*(*reconst_list_1)[iev])[i].py;
                double pz_1 = (*(*reconst_list_1)[iev])[i].pz;
                double t_1 = (*(*reconst_list_1)[iev])[i].t;
                double x_1 = (*(*reconst_list_1)[iev])[i].x;
                double y_1 = (*(*reconst_list_1)[iev])[i].y;
                double z_1 = (*(*reconst_list_1)[iev])[i].z;
                for (unsigned int j = 0; j < (*reconst_list_2)[iev]->size();
                     j++) {
                    double E_2 = (*(*reconst_list_2)[iev])[j].E;
                    double px_2 = (*(*reconst_list_2)[iev])[j].px;
                    double py_2 = (*(*reconst_list_2)[iev])[j].py;
                    double pz_2 = (*(*reconst_list_2)[iev])[j].pz;
                    double t_2 = (*(*reconst_list_2)[iev])[j].t;
                    double x_2 = (*(*reconst_list_2)[iev])[j].x;
                    double y_2 = (*(*reconst_list_2)[iev])[j].y;
                    double z_2 = (*(*reconst_list_2)[iev])[j].z;

                    // compute the invariant mass
                    double E = E_1 + E_2;
                    double px = px_1 + px_2;
                    double py = py_1 + py_2;
                    double pz = pz_1 + pz_2;
                    double invariant_mass =
                        sqrt(E * E - px * px - py * py - pz * pz);
                    if (std::abs(invariant_mass - particle_mass)
                        < particle_width) {
                        // phi(1020) resonance found
                        double spatial_distance = sqrt(
                            (t_1 - t_2) * (t_1 - t_2)
                            + (x_1 - x_2) * (x_1 - x_2)
                            + (y_1 - y_2) * (y_1 - y_2)
                            + (z_1 - z_2) * (z_1 - z_2));
                        if (spatial_distance < 0.01) {
                            // this is a real phi(1020)
                            particle_info *mother = new particle_info;
                            mother->mass = particle_mass;
                            mother->E = E;
                            mother->px = px;
                            mother->py = py;
                            mother->pz = pz;
                            mother->t = (t_1 + t_2) / 2.;
                            mother->x = (x_1 + x_2) / 2.;
                            mother->y = (y_1 + y_2) / 2.;
                            mother->z = (z_1 + z_2) / 2.;
                            (*particle_list)[iev]->push_back(*mother);
                        }
                    }
                }
            }
        }
    }
}